

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O1

InterfaceSchema __thiscall capnp::Schema::asInterface(Schema *this)

{
  Schema SVar1;
  bool bVar2;
  DebugExpression<bool> _kjCondition;
  StructReader local_80;
  Fault f;
  ArrayPtr<const_char> local_48;
  WirePointer *local_38;
  int local_30;
  
  local_38 = (WirePointer *)this->raw->generic->encodedNode;
  local_48 = (ArrayPtr<const_char>)ZEXT816(0);
  local_30 = 0x7fffffff;
  bVar2 = false;
  capnp::_::PointerReader::getStruct(&local_80,(PointerReader *)&local_48,(word *)0x0);
  if (0x6f < local_80.dataSize) {
    bVar2 = *(short *)((long)local_80.data + 0xc) == 3;
  }
  if (bVar2 == false) {
    local_38 = (WirePointer *)this->raw->generic->encodedNode;
    local_48 = (ArrayPtr<const_char>)ZEXT816(0);
    local_30 = 0x7fffffff;
    _kjCondition.value = bVar2;
    capnp::_::PointerReader::getStruct(&local_80,(PointerReader *)&local_48,(word *)0x0);
    if (local_80.pointerCount == 0) {
      local_80.nestingLimit = 0x7fffffff;
      local_80.pointers = (WirePointer *)0x0;
      local_80.segment = (SegmentReader *)0x0;
      local_80.capTable = (CapTableReader *)0x0;
    }
    local_48.size_ = (size_t)local_80.capTable;
    local_48.ptr = (char *)local_80.segment;
    local_38 = local_80.pointers;
    local_30 = local_80.nestingLimit;
    local_48 = (ArrayPtr<const_char>)
               capnp::_::PointerReader::getBlob<capnp::Text>
                         ((PointerReader *)&local_48,(void *)0x0,0);
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[51],capnp::Text::Reader>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema.c++"
               ,299,FAILED,"getProto().isInterface()",
               "_kjCondition,\"Tried to use non-interface schema as an interface.\", getProto().getDisplayName()"
               ,&_kjCondition,(char (*) [51])"Tried to use non-interface schema as an interface.",
               (Reader *)&local_48);
    kj::_::Debug::Fault::~Fault(&f);
    SVar1.raw = (RawBrandedSchema *)(capnp::_::NULL_INTERFACE_SCHEMA + 0x48);
  }
  else {
    SVar1 = (Schema)this->raw;
  }
  return (InterfaceSchema)SVar1.raw;
}

Assistant:

InterfaceSchema Schema::asInterface() const {
  KJ_REQUIRE(getProto().isInterface(), "Tried to use non-interface schema as an interface.",
             getProto().getDisplayName()) {
    return InterfaceSchema();
  }
  return InterfaceSchema(*this);
}